

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O3

MPP_RET parse_picture_header_comm(Avs2dCtx_t *p_dec)

{
  BitReadCtx_t *bitctx;
  RK_U8 RVar1;
  uint uVar2;
  RK_U32 (*paRVar3) [64];
  MPP_RET MVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  char *fmt;
  ulong uVar8;
  bool bVar9;
  RK_S32 _out;
  uint local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  ulong local_48;
  RK_U32 (*local_40) [64];
  RK_U32 (*local_38) [64];
  
  bitctx = &p_dec->bitctx;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","In","parse_picture_header_comm");
  }
  MVar4 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_58);
  (p_dec->bitctx).ret = MVar4;
  if (MVar4 != MPP_OK) goto LAB_00185b14;
  (p_dec->ph).enable_loop_filter = (byte)local_58 ^ 1;
  if ((byte)local_58 == 1) {
LAB_00185b6b:
    MVar4 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_58);
    (p_dec->bitctx).ret = MVar4;
    if (MVar4 != MPP_OK) goto LAB_00185b14;
    uVar8 = (ulong)local_58 ^ 1;
    (p_dec->ph).enable_chroma_quant_param = (RK_U8)uVar8;
    if ((char)local_58 == '\x01') {
      (p_dec->ph).chroma_quant_param_delta_cb = '\0';
      (p_dec->ph).chroma_quant_param_delta_cr = '\0';
    }
    else {
      MVar4 = mpp_read_se(bitctx,(RK_S32 *)&local_58);
      (p_dec->bitctx).ret = MVar4;
      if (MVar4 != MPP_OK) goto LAB_00185b14;
      (p_dec->ph).chroma_quant_param_delta_cb = (RK_U8)local_58;
      MVar4 = mpp_read_se(bitctx,(RK_S32 *)&local_58);
      (p_dec->bitctx).ret = MVar4;
      if (MVar4 != MPP_OK) goto LAB_00185b14;
      (p_dec->ph).chroma_quant_param_delta_cr = (char)local_58;
      bVar9 = (byte)((p_dec->ph).chroma_quant_param_delta_cb - 0x11U) < 0xdf;
      uVar8 = CONCAT71((int7)(uVar8 >> 8),bVar9);
      if ((byte)((char)local_58 - 0x11U) < 0xdf || bVar9) {
        fmt = "invalid chrome quant param delta.\n";
        goto LAB_00185de2;
      }
    }
    p_dec->enable_wq = '\0';
    if ((p_dec->vsh).enable_weighted_quant != '\0') {
      MVar4 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_58);
      (p_dec->bitctx).ret = MVar4;
      if (MVar4 != MPP_OK) goto LAB_00185b14;
      (p_dec->ph).enable_pic_weight_quant = (RK_U8)local_58;
      if ((RK_U8)local_58 != '\0') {
        p_dec->enable_wq = '\x01';
        MVar4 = mpp_read_bits(bitctx,2,(RK_S32 *)&local_58);
        (p_dec->bitctx).ret = MVar4;
        if (MVar4 != MPP_OK) goto LAB_00185b14;
        (p_dec->ph).pic_wq_data_index = (RK_U8)local_58;
        if ((local_58 & 0xff) == 1) {
          MVar4 = mpp_skip_longbits(bitctx,1);
          (p_dec->bitctx).ret = MVar4;
          if (MVar4 != MPP_OK) {
LAB_00185b14:
            if (((byte)avs2d_parse_debug & 8) != 0) {
              _mpp_log_l(4,"avs2d_ps","Out, Bit read Err","parse_picture_header_comm");
              MVar4 = (p_dec->bitctx).ret;
            }
            return MVar4;
          }
          MVar4 = mpp_read_bits(bitctx,2,(RK_S32 *)&local_58);
          (p_dec->bitctx).ret = MVar4;
          if (MVar4 != MPP_OK) goto LAB_00185b14;
          (p_dec->ph).wq_param_index = (RK_U8)local_58;
          MVar4 = mpp_read_bits(bitctx,2,(RK_S32 *)&local_58);
          (p_dec->bitctx).ret = MVar4;
          if (MVar4 != MPP_OK) goto LAB_00185b14;
          (p_dec->ph).wq_model = (RK_U8)local_58;
          RVar1 = (p_dec->ph).wq_param_index;
          if (RVar1 == '\x01') {
            lVar7 = 0;
            do {
              MVar4 = mpp_read_se(bitctx,(RK_S32 *)&local_58);
              (p_dec->bitctx).ret = MVar4;
              if (MVar4 != MPP_OK) goto LAB_00185b14;
              (p_dec->ph).wq_param_delta1[lVar7] = local_58;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 6);
          }
          else if (RVar1 == '\x02') {
            lVar7 = 0;
            do {
              MVar4 = mpp_read_se(bitctx,(RK_S32 *)&local_58);
              (p_dec->bitctx).ret = MVar4;
              if (MVar4 != MPP_OK) goto LAB_00185b14;
              (p_dec->ph).wq_param_delta2[lVar7] = local_58;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 6);
          }
        }
        else if ((local_58 & 0xff) == 2) {
          local_40 = (p_dec->ph).pic_wq_matrix;
          local_54 = (uint)CONCAT71((int7)(uVar8 >> 8),1);
          lVar7 = 0;
          do {
            local_48 = (ulong)(uint)(4 << (sbyte)lVar7);
            local_50 = (uint)lVar7 | 2;
            local_38 = local_40 + lVar7;
            iVar5 = 0;
            do {
              paRVar3 = local_38;
              bVar6 = (byte)local_50;
              uVar8 = 0;
              local_4c = iVar5;
              do {
                MVar4 = mpp_read_ue(bitctx,&local_58);
                (p_dec->bitctx).ret = MVar4;
                if (MVar4 != MPP_OK) goto LAB_00185b14;
                (*paRVar3)[(uint)(iVar5 << (bVar6 & 0x1f)) + uVar8] = local_58;
                uVar8 = uVar8 + 1;
              } while (local_48 != uVar8);
              iVar5 = local_4c + 1;
            } while (iVar5 != (int)local_48);
            lVar7 = 1;
            uVar2 = local_54 & 1;
            local_54 = 0;
          } while (uVar2 != 0);
        }
      }
    }
    if ((p_dec->vsh).enable_alf == '\0') {
      uVar8 = 0;
    }
    else {
      MVar4 = parse_pic_alf_params(bitctx,&p_dec->ph);
      uVar8 = (ulong)(uint)MVar4;
      if (MVar4 < MPP_OK) {
        if (((byte)avs2d_parse_debug & 4) != 0) {
          _mpp_log_l(4,"avs2d_ps","Function error(%d).\n",(char *)0x0,0x23c);
        }
        goto LAB_00185f38;
      }
    }
    if (((byte)avs2d_parse_debug & 8) == 0) {
      return (MPP_RET)uVar8;
    }
    _mpp_log_l(4,"avs2d_ps","Out, ret %d\n","parse_picture_header_comm",uVar8);
    return (MPP_RET)uVar8;
  }
  MVar4 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_58);
  (p_dec->bitctx).ret = MVar4;
  if (MVar4 != MPP_OK) goto LAB_00185b14;
  (p_dec->ph).loop_filter_parameter_flag = (RK_U8)local_58;
  if ((RK_U8)local_58 == '\0') {
    (p_dec->ph).alpha_c_offset = '\0';
    (p_dec->ph).beta_offset = '\0';
    goto LAB_00185b6b;
  }
  MVar4 = mpp_read_se(bitctx,(RK_S32 *)&local_58);
  (p_dec->bitctx).ret = MVar4;
  if (MVar4 != MPP_OK) goto LAB_00185b14;
  (p_dec->ph).alpha_c_offset = (RK_U8)local_58;
  MVar4 = mpp_read_se(bitctx,(RK_S32 *)&local_58);
  (p_dec->bitctx).ret = MVar4;
  if (MVar4 != MPP_OK) goto LAB_00185b14;
  (p_dec->ph).beta_offset = (char)local_58;
  if (0xee < (byte)((char)local_58 - 9U) && 0xee < (byte)((p_dec->ph).alpha_c_offset - 9U))
  goto LAB_00185b6b;
  fmt = "invalid alpha_c_offset/beta_offset.\n";
LAB_00185de2:
  _mpp_log_l(2,"avs2d_ps",fmt,"parse_picture_header_comm");
  MVar4 = MPP_NOK;
LAB_00185f38:
  if (((byte)avs2d_parse_debug & 8) == 0) {
    return MVar4;
  }
  _mpp_log_l(4,"avs2d_ps","Out, Failed","parse_picture_header_comm");
  return MVar4;
}

Assistant:

static MPP_RET parse_picture_header_comm(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i, j;
    RK_U32 val_temp = 0;

    BitReadCtx_t *bitctx  = &p_dec->bitctx;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;
    Avs2dPicHeader_t *ph  = &p_dec->ph;

    AVS2D_PARSE_TRACE("In");
    READ_ONEBIT(bitctx, &val_temp);
    ph->enable_loop_filter = val_temp ^ 0x01;
    if (ph->enable_loop_filter) {
        READ_ONEBIT(bitctx, &ph->loop_filter_parameter_flag);
        if (ph->loop_filter_parameter_flag) {
            READ_SE(bitctx, &ph->alpha_c_offset);
            READ_SE(bitctx, &ph->beta_offset);
            if (ph->alpha_c_offset < -8 || ph->alpha_c_offset > 8 ||
                ph->beta_offset < -8 || ph->beta_offset > 8) {
                ret = MPP_NOK;
                mpp_err_f("invalid alpha_c_offset/beta_offset.\n");
                goto __FAILED;
            }
        } else {
            ph->alpha_c_offset = 0;
            ph->beta_offset    = 0;
        }
    }

    READ_ONEBIT(bitctx, &val_temp);
    ph->enable_chroma_quant_param = val_temp ^ 0x01;
    if (ph->enable_chroma_quant_param) {
        READ_SE(bitctx, &ph->chroma_quant_param_delta_cb);
        READ_SE(bitctx, &ph->chroma_quant_param_delta_cr);
    } else {
        ph->chroma_quant_param_delta_cb = 0;
        ph->chroma_quant_param_delta_cr = 0;
    }
    if (ph->chroma_quant_param_delta_cb < -16 || ph->chroma_quant_param_delta_cb > 16 ||
        ph->chroma_quant_param_delta_cr < -16 || ph->chroma_quant_param_delta_cr > 16) {
        ret = MPP_NOK;
        mpp_err_f("invalid chrome quant param delta.\n");
        goto __FAILED;
    }

    p_dec->enable_wq = 0;
    if (vsh->enable_weighted_quant) {
        READ_ONEBIT(bitctx, &ph->enable_pic_weight_quant);
        if (ph->enable_pic_weight_quant) {
            p_dec->enable_wq = 1;
            READ_BITS(bitctx, 2, &ph->pic_wq_data_index);
            if (ph->pic_wq_data_index == 1) {
                SKIP_BITS(bitctx, 1);
                READ_BITS(bitctx, 2, &ph->wq_param_index);
                READ_BITS(bitctx, 2, &ph->wq_model);
                if (ph->wq_param_index == 1) {
                    for (i = 0; i < 6; i++) {
                        READ_SE(bitctx, &ph->wq_param_delta1[i]);
                    }
                } else if (ph->wq_param_index == 2) {
                    for (i = 0; i < 6; i++) {
                        READ_SE(bitctx, &ph->wq_param_delta2[i]);
                    }
                }
            } else if (ph->pic_wq_data_index == 2) {
                RK_U32 size_id, wqm_size;
                for (size_id = 0; size_id < 2; size_id++) {
                    wqm_size = MPP_MIN(1 << (size_id + 2), 8);
                    for (j = 0; j < wqm_size; j++) {
                        for (i = 0; i < wqm_size; i++) {
                            READ_UE(bitctx, &ph->pic_wq_matrix[size_id][j * wqm_size + i]);
                        }
                    }
                }
            }

        }
    }

    if (vsh->enable_alf) {
        FUN_CHECK(ret = parse_pic_alf_params(bitctx, ph));
    }

    AVS2D_PARSE_TRACE("Out, ret %d\n", ret);
    return ret;
__BITREAD_ERR:
    AVS2D_PARSE_TRACE("Out, Bit read Err");
    return ret = bitctx->ret;
__FAILED:
    AVS2D_PARSE_TRACE("Out, Failed");
    return ret;
}